

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O1

void __thiscall
dynet::NaryTreeLSTMBuilder::start_new_sequence_impl
          (NaryTreeLSTMBuilder *this,
          vector<dynet::Expression,_std::allocator<dynet::Expression>_> *hinit)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pEVar3;
  undefined8 uVar4;
  bool bVar5;
  long lVar6;
  ostream *poVar7;
  invalid_argument *this_00;
  ulong uVar8;
  ostringstream oss;
  string asStack_1b8 [32];
  ostringstream local_198 [376];
  
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::clear(&this->h);
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::clear(&this->c);
  lVar6 = (long)(hinit->super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(hinit->super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar6 == 0) {
    bVar5 = false;
  }
  else {
    if (lVar6 >> 4 != (ulong)(this->layers * 2)) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"Incorrectly sized initialization in TreeLSTM (",0x2e);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"). Must be twice the number of layers (which is ",0x30);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::invalid_argument::invalid_argument(this_00,asStack_1b8);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::resize
              (&this->h0,(ulong)this->layers);
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::resize
              (&this->c0,(ulong)this->layers);
    bVar5 = true;
    if (this->layers != 0) {
      lVar6 = 0;
      uVar8 = 0;
      do {
        puVar1 = (undefined8 *)
                 ((long)&((hinit->
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>)
                          ._M_impl.super__Vector_impl_data._M_start)->pg + lVar6);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)
                 ((long)&((this->c0).
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                          _M_impl.super__Vector_impl_data._M_start)->pg + lVar6);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        pEVar3 = (hinit->super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                 _M_impl.super__Vector_impl_data._M_start + (this->layers + (int)uVar8);
        uVar4 = *(undefined8 *)&pEVar3->i;
        puVar1 = (undefined8 *)
                 ((long)&((this->h0).
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                          _M_impl.super__Vector_impl_data._M_start)->pg + lVar6);
        *puVar1 = pEVar3->pg;
        puVar1[1] = uVar4;
        uVar8 = uVar8 + 1;
        lVar6 = lVar6 + 0x10;
      } while (uVar8 < this->layers);
    }
  }
  this->has_initial_state = bVar5;
  return;
}

Assistant:

void NaryTreeLSTMBuilder::start_new_sequence_impl(const vector<Expression>& hinit) {
  h.clear();
  c.clear();
  if (hinit.size() > 0) {
    DYNET_ARG_CHECK(layers*2 == hinit.size(),
                            "Incorrectly sized initialization in TreeLSTM (" << hinit.size() << "). "
                            "Must be twice the number of layers (which is " << layers<< ")");
    h0.resize(layers);
    c0.resize(layers);
    for (unsigned i = 0; i < layers; ++i) {
      c0[i] = hinit[i];
      h0[i] = hinit[i + layers];
    }
    has_initial_state = true;
  } else {
    has_initial_state = false;
  }
}